

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem.c
# Opt level: O0

int nn_sem_wait(nn_sem *self)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  sem_t *in_RDI;
  bool bVar5;
  int rc;
  int local_4;
  
  iVar1 = sem_wait(in_RDI);
  bVar5 = false;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    bVar5 = *piVar2 == 4;
  }
  if (bVar5) {
    local_4 = -4;
  }
  else {
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      __errno_location();
      pcVar3 = nn_err_strerror((int)((ulong)__stream >> 0x20));
      puVar4 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/sem.c"
              ,0xa2);
      fflush(_stderr);
      nn_err_abort();
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_sem_wait (struct nn_sem *self)
{
    int rc;

    rc = sem_wait (&self->sem);
    if (nn_slow (rc < 0 && errno == EINTR))
        return -EINTR;
    errno_assert (rc == 0);
    return 0;
}